

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceDiffusion.cpp
# Opt level: O2

void __thiscall
OpenMD::SurfaceDiffusion::SurfaceDiffusion
          (SurfaceDiffusion *this,SimInfo *info,string *filename,string *sele,RealType param_4)

{
  SelectionEvaluator *this_00;
  SelectionManager *this_01;
  int iVar1;
  ostream *poVar2;
  SelectionSet local_48;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__SurfaceDiffusion_002ee888;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->seleMan1_;
  SelectionManager::SelectionManager(this_01,info);
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  memset(&this->positions_,0,0x198);
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_48,this_00);
    SelectionManager::setSelectionSet(this_01,&local_48);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_48.bitsets_);
  }
  iVar1 = SelectionManager::getSelectionCount(this_01);
  this->selectionCount_ = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"SelectionCount_: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->selectionCount_);
  std::operator<<(poVar2,"\n");
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(&this->moBool_,(long)this->selectionCount_);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::resize(&this->positions_,(long)this->selectionCount_);
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  this->singleMoveDistance_ = 2.0;
  return;
}

Assistant:

SurfaceDiffusion::SurfaceDiffusion(SimInfo* info, const std::string& filename,
                                     const std::string& sele, RealType) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), evaluator_(info), seleMan1_(info) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator_.evaluate());
    }

    // Depending on the selection 'sele1="select Pt"' need a vector equal to the
    // number of Platinums in the system (for this specific case)
    selectionCount_ = seleMan1_.getSelectionCount();
    cout << "SelectionCount_: " << selectionCount_ << "\n";

    moBool_.resize(selectionCount_);
    positions_.resize(selectionCount_);

    filename_           = filename;
    singleMoveDistance_ = 2.0;
  }